

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint auto_choose_color(LodePNGColorMode *mode_out,LodePNGColorMode *mode_in,LodePNGColorStats *stats
                      )

{
  ulong uVar1;
  undefined4 uVar2;
  uint uVar3;
  ulong uVar4;
  int *in_RDX;
  int *in_RSI;
  undefined4 *in_RDI;
  bool bVar5;
  bool bVar6;
  uint mask;
  uchar *p;
  uint bits;
  uint key;
  uint alpha;
  uint gray_ok;
  uint palette_ok;
  size_t numpixels;
  size_t n;
  size_t i;
  uint palettebits;
  uint error;
  LodePNGColorMode *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint3 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  uint local_60;
  uint local_4c;
  int local_48;
  int local_44;
  uint local_3c;
  ulong local_28;
  uint local_1c;
  
  local_1c = 0;
  uVar1 = *(ulong *)(in_RDX + 0x108);
  local_44 = in_RDX[4];
  local_48 = in_RDX[1];
  local_4c = in_RDX[0x106];
  in_RDI[6] = 0;
  if ((local_48 != 0) && (uVar1 < 0x11)) {
    local_44 = 1;
    local_48 = 0;
    if (local_4c < 8) {
      local_4c = 8;
    }
  }
  bVar5 = *in_RDX == 0;
  bVar6 = in_RDX[0x10b] != 0;
  if ((!bVar6 || !bVar5) && (local_4c < 8)) {
    local_4c = 8;
  }
  uVar4 = (ulong)(uint)in_RDX[5];
  if (uVar4 < 3) {
    local_60 = 1;
  }
  else if (uVar4 < 5) {
    in_stack_ffffffffffffff9c = 2;
    local_60 = in_stack_ffffffffffffff9c;
  }
  else {
    in_stack_ffffffffffffff9c = 8;
    local_60 = in_stack_ffffffffffffff9c;
    if (uVar4 < 0x11) {
      in_stack_ffffffffffffff9c = 4;
      local_60 = in_stack_ffffffffffffff9c;
    }
  }
  uVar3 = (uint)in_stack_ffffffffffffff98;
  if ((uVar4 < 0x101) && (uVar3 = (uint)in_stack_ffffffffffffff98, local_4c < 9)) {
    uVar3 = CONCAT13(uVar4 != 0,in_stack_ffffffffffffff98);
  }
  local_3c = uVar3 >> 0x18;
  if (uVar1 < uVar4 << 1) {
    local_3c = 0;
  }
  if ((bVar6 && bVar5) && (local_4c <= local_60)) {
    local_3c = 0;
  }
  if (in_RDX[0x10a] == 0) {
    local_3c = 0;
  }
  if (local_3c == 0) {
    in_RDI[1] = local_4c;
    if (local_44 == 0) {
      uVar2 = 2;
      if (bVar6 && bVar5) {
        uVar2 = 0;
      }
    }
    else {
      uVar2 = 6;
      if (bVar6 && bVar5) {
        uVar2 = 4;
      }
    }
    *in_RDI = uVar2;
    if (local_48 != 0) {
      uVar3 = (1 << ((byte)in_RDI[1] & 0x1f)) - 1;
      in_RDI[7] = *(ushort *)(in_RDX + 2) & uVar3;
      in_RDI[8] = *(ushort *)((long)in_RDX + 10) & uVar3;
      in_RDI[9] = *(ushort *)(in_RDX + 3) & uVar3;
      in_RDI[6] = 1;
    }
  }
  else {
    lodepng_palette_clear((LodePNGColorMode *)0x12d402);
    local_28 = 0;
    while ((local_28 != (uint)in_RDX[5] &&
           (local_1c = lodepng_palette_add(in_stack_ffffffffffffff88,'\0','\0','\0','\0'),
           local_1c == 0))) {
      local_28 = local_28 + 1;
    }
    *in_RDI = 3;
    in_RDI[1] = local_60;
    if (((*in_RSI == 3) && (*(ulong *)(in_RDI + 4) <= *(ulong *)(in_RSI + 4))) &&
       (in_RSI[1] == in_RDI[1])) {
      lodepng_color_mode_cleanup((LodePNGColorMode *)0x12d4f2);
      lodepng_color_mode_copy
                ((LodePNGColorMode *)CONCAT44(in_stack_ffffffffffffff9c,uVar3),
                 (LodePNGColorMode *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
  }
  return local_1c;
}

Assistant:

unsigned auto_choose_color(LodePNGColorMode* mode_out,
                           const LodePNGColorMode* mode_in,
                           const LodePNGColorStats* stats) {
  unsigned error = 0;
  unsigned palettebits;
  size_t i, n;
  size_t numpixels = stats->numpixels;
  unsigned palette_ok, gray_ok;

  unsigned alpha = stats->alpha;
  unsigned key = stats->key;
  unsigned bits = stats->bits;

  mode_out->key_defined = 0;

  if(key && numpixels <= 16) {
    alpha = 1; /*too few pixels to justify tRNS chunk overhead*/
    key = 0;
    if(bits < 8) bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
  }

  gray_ok = !stats->colored;
  if(!stats->allow_greyscale) gray_ok = 0;
  if(!gray_ok && bits < 8) bits = 8;

  n = stats->numcolors;
  palettebits = n <= 2 ? 1 : (n <= 4 ? 2 : (n <= 16 ? 4 : 8));
  palette_ok = n <= 256 && bits <= 8 && n != 0; /*n==0 means likely numcolors wasn't computed*/
  if(numpixels < n * 2) palette_ok = 0; /*don't add palette overhead if image has only a few pixels*/
  if(gray_ok && bits <= palettebits) palette_ok = 0; /*gray is less overhead*/
  if(!stats->allow_palette) palette_ok = 0;

  if(palette_ok) {
    const unsigned char* p = stats->palette;
    lodepng_palette_clear(mode_out); /*remove potential earlier palette*/
    for(i = 0; i != stats->numcolors; ++i) {
      error = lodepng_palette_add(mode_out, p[i * 4 + 0], p[i * 4 + 1], p[i * 4 + 2], p[i * 4 + 3]);
      if(error) break;
    }

    mode_out->colortype = LCT_PALETTE;
    mode_out->bitdepth = palettebits;

    if(mode_in->colortype == LCT_PALETTE && mode_in->palettesize >= mode_out->palettesize
        && mode_in->bitdepth == mode_out->bitdepth) {
      /*If input should have same palette colors, keep original to preserve its order and prevent conversion*/
      lodepng_color_mode_cleanup(mode_out);
      lodepng_color_mode_copy(mode_out, mode_in);
    }
  } else /*8-bit or 16-bit per channel*/ {
    mode_out->bitdepth = bits;
    mode_out->colortype = alpha ? (gray_ok ? LCT_GREY_ALPHA : LCT_RGBA)
                                : (gray_ok ? LCT_GREY : LCT_RGB);
    if(key) {
      unsigned mask = (1u << mode_out->bitdepth) - 1u; /*stats always uses 16-bit, mask converts it*/
      mode_out->key_r = stats->key_r & mask;
      mode_out->key_g = stats->key_g & mask;
      mode_out->key_b = stats->key_b & mask;
      mode_out->key_defined = 1;
    }
  }

  return error;
}